

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O3

void dw3_female_wizard(dw_rom *rom)

{
  undefined8 uVar1;
  
  vpatch(rom,0x87da,2,0xe,0x1b);
  vpatch(rom,0x13b4,0x50,0x50,1,0x51,1,0x52,1,0x53,1,0x54,1,0x55,1,0x56,1,0x57,1,0x50,1,0x51,1,0x52,
         1,0x53,1,0x54,1,0x55,1,0x56,1,0x57,1,0x50,1,0x51,1,0x52,1,0x53,1,0x54,1,0x55,1,0x56,1,0x57,
         1,0x50,1,0x51,1,0x52,1,0x53,1,0x54,1,0x55,1,0x56,1,0x57,1,0x50);
  vpatch(rom,0x14b4,0x4e,0x48,1,0x49,1,0x4a,1,0x4b,1,0x4c,1,0x4d,1,0x4e,1,0x4f,1,0x48,1,0x49,1,0x4a,
         1,0x4b,1,0x4c,1,0x4d,1,0x4e,1,0x4f,1,0x48,1,0x49,1,0x4a,1,0x4b,1,0x4c,1,0x4d,1,0x4e,1,0x4f,
         1,0x48,1,0x49,1,0x4a,1,0x4b,1,0x4c,1,0x4d,1,0x4e,1,0x4f,1,0x48);
  vpatch(rom,0x15b4,0x44,0x30,1,0x31,1,0x32,1,0x33,1,0x34,1,0x35,1,0x36,1,0x37,1,0x30,1,0x31,1,0x32,
         1,0x33,1,0x34,1,0x35,1,0x36,1,0x37,1,0x30,1,0x31,1,0x32,1,0x33,1,0x34,1,0x35,1,0x36,1,0x37,
         1,0x30,1,0x31,1,0x32,1,0x33,1,0x34,1,0x35,1,0x36,1,0x37,1,0xb4);
  vpatch(rom,0x15fe,2,0x35,1);
  vpatch(rom,0x16b4,0x44,0x40,1,0x41,1,0x42,1,0x43,1,0x44,1,0x45,1,0x46,1,0x47,1,0x40,1,0x41,1,0x42,
         1,0x43,1,0x44,1,0x45,1,0x46,1,0x47,1,0x40,1,0x41,1,0x42,1,0x43,1,0x44,1,0x45,1,0x46,1,0x47,
         1,0x40,1,0x41,1,0x42,1,0x43,1,0x44,1,0x45,1,0x46,1,0x47,1,0xb8);
  vpatch(rom,0x16fe,2,0x45,1);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8e,3,0x36,0x19,6);
  vpatch(rom,0x121c0,8,0x80,0x84,0,0xf4,0x80,0,0xf8,0xf8);
  vpatch(rom,0x121d0,8,0,0,7,0x18,5,0x1d,0xe,0xd);
  vpatch(rom,0x121e0,7,0xc0,0xc1,0x40,0x3d,0,0,0x1e);
  vpatch(rom,0x121f0,8,2,0x87,0xf,0xbe,0,0,0xf8,0xf8);
  vpatch(rom,0x12200,0x28,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0x18
         ,7,0x10,8,7);
  vpatch(rom,0x12230,7,3,7,7,0x1f,3,0,0xf);
  uVar1 = 0x1e;
  vpatch(rom,0x12240,0x67,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,
         0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  vpatch(rom,0x122b0,8,3,3,2,0xfc,0,0,0xf8,0xf8,uVar1);
  vpatch(rom,0x122c0,8,0,0,0,3,0x1c,1,0,6,uVar1);
  vpatch(rom,0x122d0,8,0,0,0x78,0x80,0x50,0xd8,0xe0,0x50,uVar1);
  vpatch(rom,0x122e0,8,1,1,1,0x1f,0,0,0xf,0xf,uVar1);
  vpatch(rom,0x122f0,8,0xb0,0xf4,0xe0,0xf4,0,0,0xf8,0x80);
  vpatch(rom,0x12300,0x80,3,7,0,0,0x7f,0xf,0x1f,0xf,3,7,0xf,0xf,0x7e,10,0x1a,0x3c,0xc0,0xe0,0,0,0xfe
         ,0xf0,0xf8,0xf4,0xc0,0xe0,0xf0,0xf0,0xfe,0x50,0x5b,0x3b,6,0x19,0x1e,0x3f,0x31,0x21,99,0xf,
         0xf,0x16,0x19,0x3d,0x3f,0x3e,0x7c,0x3f,0x6c,0x98,0x38,0xfc,0xcc,0x84,6,0,0xf0,0x60,0xf8,
         0xbc,0xbc,0x7c,0xfe,0xfc,3);
  vpatch(rom,0x12400,0x180,1,3,0,0,0x1f,7,7,3,1,3,7,7,0x1f,2,2,8,0xc0,0xe0,0,0,0xfe,0xf0,0xf8,0xfc,
         0xc0,0xe0,0xf0,0xf0,0xfe,0xf0,0x40,0xb8,1,1,0xf,0xf,0x18,0x18,8,0xb,0x1c,10,0xc,0xd,0x13,
         0x1b,0xf,7,0xf0,0xf8,0x78,0xbc,0x3c,0x1e,7,0xc0,0xf0,0x78,0xf8,0xfc,0xdc,0xe6,0xf8,0xfc,1);
  return;
}

Assistant:

static void dw3_female_wizard(dw_rom *rom)
{
    vpatch(rom, 0x087da,    2,  0x0e,  0x1b); // his -> her
    vpatch(rom, 0x013b4,   80,  0x50,  0x01,  0x51,  0x01,  0x52,  0x01,  0x53,  0x01,  0x54,  0x01,  0x55,  0x01,  0x56,  0x01,  0x57,  0x01,  0x50,  0x01,  0x51,  0x01,  0x52,  0x01,  0x53,  0x01,  0x54,  0x01,  0x55,  0x01,  0x56,  0x01,  0x57,  0x01,  0x50,  0x01,  0x51,  0x01,  0x52,  0x01,  0x53,  0x01,  0x54,  0x01,  0x55,  0x01,  0x56,  0x01,  0x57,  0x01,  0x50,  0x01,  0x51,  0x01,  0x52,  0x01,  0x53,  0x01,  0x54,  0x01,  0x55,  0x01,  0x56,  0x01,  0x57,  0x01,  0x50,  0x01,  0x51,  0x01,  0x52,  0x01,  0x53,  0x01,  0x54,  0x01,  0x55,  0x01,  0x56,  0x01,  0x57,  0x01);
    vpatch(rom, 0x014b4,   78,  0x48,  0x01,  0x49,  0x01,  0x4a,  0x01,  0x4b,  0x01,  0x4c,  0x01,  0x4d,  0x01,  0x4e,  0x01,  0x4f,  0x01,  0x48,  0x01,  0x49,  0x01,  0x4a,  0x01,  0x4b,  0x01,  0x4c,  0x01,  0x4d,  0x01,  0x4e,  0x01,  0x4f,  0x01,  0x48,  0x01,  0x49,  0x01,  0x4a,  0x01,  0x4b,  0x01,  0x4c,  0x01,  0x4d,  0x01,  0x4e,  0x01,  0x4f,  0x01,  0x48,  0x01,  0x49,  0x01,  0x4a,  0x01,  0x4b,  0x01,  0x4c,  0x01,  0x4d,  0x01,  0x4e,  0x01,  0x4f,  0x01,  0x48,  0x01,  0xa9,  0x03,  0x4a,  0x01,  0xab,  0x03,  0x4c,  0x01,  0xad,  0x03,  0x4e,  0x01);
    vpatch(rom, 0x015b4,   68,  0x30,  0x01,  0x31,  0x01,  0x32,  0x01,  0x33,  0x01,  0x34,  0x01,  0x35,  0x01,  0x36,  0x01,  0x37,  0x01,  0x30,  0x01,  0x31,  0x01,  0x32,  0x01,  0x33,  0x01,  0x34,  0x01,  0x35,  0x01,  0x36,  0x01,  0x37,  0x01,  0x30,  0x01,  0x31,  0x01,  0x32,  0x01,  0x33,  0x01,  0x34,  0x01,  0x35,  0x01,  0x36,  0x01,  0x37,  0x01,  0x30,  0x01,  0x31,  0x01,  0x32,  0x01,  0x33,  0x01,  0x34,  0x01,  0x35,  0x01,  0x36,  0x01,  0x37,  0x01,  0xb4,  0x03,  0x31,  0x01);
    vpatch(rom, 0x015fe,    2,  0x35,  0x01);
    vpatch(rom, 0x016b4,   68,  0x40,  0x01,  0x41,  0x01,  0x42,  0x01,  0x43,  0x01,  0x44,  0x01,  0x45,  0x01,  0x46,  0x01,  0x47,  0x01,  0x40,  0x01,  0x41,  0x01,  0x42,  0x01,  0x43,  0x01,  0x44,  0x01,  0x45,  0x01,  0x46,  0x01,  0x47,  0x01,  0x40,  0x01,  0x41,  0x01,  0x42,  0x01,  0x43,  0x01,  0x44,  0x01,  0x45,  0x01,  0x46,  0x01,  0x47,  0x01,  0x40,  0x01,  0x41,  0x01,  0x42,  0x01,  0x43,  0x01,  0x44,  0x01,  0x45,  0x01,  0x46,  0x01,  0x47,  0x01,  0xb8,  0x03,  0x41,  0x01);
    vpatch(rom, 0x016fe,    2,  0x45,  0x01);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8e,    3,  0x36,  0x19,  0x06);
    vpatch(rom, 0x121c0,    8,  0x80,  0x84,  0x00,  0xf4,  0x80,  0x00,  0xf8,  0xf8);
    vpatch(rom, 0x121d0,    8,  0x00,  0x00,  0x07,  0x18,  0x05,  0x1d,  0x0e,  0x0d);
    vpatch(rom, 0x121e0,    7,  0xc0,  0xc1,  0x40,  0x3d,  0x00,  0x00,  0x1e);
    vpatch(rom, 0x121f0,    8,  0x02,  0x87,  0x0f,  0xbe,  0x00,  0x00,  0xf8,  0xf8);
    vpatch(rom, 0x12200,   40,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x18,  0x07,  0x10,  0x08,  0x07);
    vpatch(rom, 0x12230,    7,  0x03,  0x07,  0x07,  0x1f,  0x03,  0x00,  0x0f);
    vpatch(rom, 0x12240,  103,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x40,  0xc0,  0xc0,  0xff,  0x00,  0x00,  0x1e);
    vpatch(rom, 0x122b0,    8,  0x03,  0x03,  0x02,  0xfc,  0x00,  0x00,  0xf8,  0xf8);
    vpatch(rom, 0x122c0,    8,  0x00,  0x00,  0x00,  0x03,  0x1c,  0x01,  0x00,  0x06);
    vpatch(rom, 0x122d0,    8,  0x00,  0x00,  0x78,  0x80,  0x50,  0xd8,  0xe0,  0x50);
    vpatch(rom, 0x122e0,    8,  0x01,  0x01,  0x01,  0x1f,  0x00,  0x00,  0x0f,  0x0f);
    vpatch(rom, 0x122f0,    8,  0xb0,  0xf4,  0xe0,  0xf4,  0x00,  0x00,  0xf8,  0x80);
    vpatch(rom, 0x12300,  128,  0x03,  0x07,  0x00,  0x00,  0x7f,  0x0f,  0x1f,  0x0f,  0x03,  0x07,  0x0f,  0x0f,  0x7e,  0x0a,  0x1a,  0x3c,  0xc0,  0xe0,  0x00,  0x00,  0xfe,  0xf0,  0xf8,  0xf4,  0xc0,  0xe0,  0xf0,  0xf0,  0xfe,  0x50,  0x5b,  0x3b,  0x06,  0x19,  0x1e,  0x3f,  0x31,  0x21,  0x63,  0x0f,  0x0f,  0x16,  0x19,  0x3d,  0x3f,  0x3e,  0x7c,  0x3f,  0x6c,  0x98,  0x38,  0xfc,  0xcc,  0x84,  0x06,  0x00,  0xf0,  0x60,  0xf8,  0xbc,  0xbc,  0x7c,  0xfe,  0xfc,  0x03,  0x07,  0x00,  0x00,  0x7f,  0x0f,  0x1f,  0x0f,  0x03,  0x07,  0x0f,  0x0f,  0x7e,  0x0a,  0x1a,  0x3c,  0xc0,  0xe0,  0x00,  0x00,  0xfe,  0xf0,  0xf8,  0xf0,  0xc0,  0xe0,  0xf0,  0xf0,  0xfe,  0x50,  0x58,  0x3e,  0x06,  0x19,  0x1c,  0x3e,  0x37,  0x23,  0x63,  0x06,  0x0f,  0x16,  0x13,  0x39,  0x3b,  0x3f,  0x7c,  0x39,  0x68,  0x98,  0x38,  0x7c,  0xec,  0x84,  0x06,  0xf0,  0xf6,  0x60,  0xc8,  0xfc,  0x7c,  0x7c,  0xfe,  0xfc);
    vpatch(rom, 0x12400,  384,  0x01,  0x03,  0x00,  0x00,  0x1f,  0x07,  0x07,  0x03,  0x01,  0x03,  0x07,  0x07,  0x1f,  0x02,  0x02,  0x08,  0xc0,  0xe0,  0x00,  0x00,  0xfe,  0xf0,  0xf8,  0xfc,  0xc0,  0xe0,  0xf0,  0xf0,  0xfe,  0xf0,  0x40,  0xb8,  0x01,  0x01,  0x0f,  0x0f,  0x18,  0x18,  0x08,  0x0b,  0x1c,  0x0a,  0x0c,  0x0d,  0x13,  0x1b,  0x0f,  0x07,  0xf0,  0xf8,  0x78,  0xbc,  0x3c,  0x1e,  0x07,  0xc0,  0xf0,  0x78,  0xf8,  0xfc,  0xdc,  0xe6,  0xf8,  0xfc,  0x01,  0x03,  0x00,  0x00,  0x1f,  0x07,  0x07,  0x03,  0x01,  0x03,  0x07,  0x07,  0x1f,  0x02,  0x0a,  0x1c,  0xc0,  0xe0,  0x00,  0x00,  0xfe,  0xf0,  0xf8,  0xfc,  0xc0,  0xe0,  0xf0,  0xf0,  0xfe,  0xf0,  0x40,  0xb8,  0x01,  0x0f,  0x0f,  0x19,  0x18,  0x08,  0x08,  0x00,  0x08,  0x0c,  0x0c,  0x11,  0x1b,  0x0b,  0x07,  0x07,  0xf0,  0xf8,  0x78,  0xbc,  0x3e,  0x1e,  0x07,  0xf0,  0xf0,  0x78,  0xf8,  0xfc,  0xde,  0xe6,  0xf8,  0xfc,  0x03,  0x07,  0x00,  0x00,  0x7f,  0x0f,  0x1f,  0x3f,  0x03,  0x07,  0x0f,  0x0f,  0x7f,  0x0f,  0x02,  0x1d,  0x80,  0xc0,  0x00,  0x00,  0xf8,  0xe0,  0xe0,  0xc0,  0x80,  0xc0,  0xe0,  0xe0,  0xf8,  0x40,  0x40,  0x10,  0x0f,  0x1e,  0x1f,  0x3d,  0x7c,  0x78,  0xe0,  0x0f,  0x0f,  0x1f,  0x1e,  0x3f,  0x7b,  0x67,  0x1f,  0x3f,  0x90,  0x18,  0x98,  0xf0,  0x70,  0x10,  0x10,  0x10,  0x38,  0xd8,  0x48,  0x30,  0xb0,  0xc0,  0xe0,  0xe0,  0x03,  0x07,  0x00,  0x00,  0x7f,  0x0f,  0x1f,  0x3f,  0x03,  0x07,  0x0f,  0x0f,  0x7f,  0x0f,  0x02,  0x1d,  0x80,  0xc0,  0x00,  0x00,  0xf8,  0xe0,  0xe0,  0xd0,  0x80,  0xc0,  0xe0,  0xe0,  0xf8,  0x40,  0x50,  0x38,  0x0f,  0x1f,  0x1e,  0x3d,  0x3c,  0x78,  0xe0,  0x03,  0x0f,  0x1e,  0x1f,  0x3f,  0x3b,  0x67,  0x1f,  0x3f,  0x98,  0x98,  0xf0,  0xf0,  0x10,  0x10,  0x10,  0xc0,  0x18,  0x48,  0x30,  0xb0,  0xc0,  0xc0,  0xe0,  0xe0,  0x01,  0x03,  0x00,  0x00,  0x3f,  0x07,  0x0f,  0x1f,  0x01,  0x03,  0x07,  0x07,  0x3f,  0x04,  0xc3,  0xcf,  0xe0,  0xf0,  0x00,  0x00,  0xff,  0xf8,  0xfc,  0xfe,  0xe0,  0xf0,  0xf8,  0xf8,  0xff,  0x08,  0xf0,  0xfc,  0x27,  0x1f,  0x0f,  0x1f,  0x1f,  0x1f,  0x38,  0x17,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x18,  0x17,  0x0f,  0xf8,  0xfc,  0xfc,  0xfe,  0xfe,  0xfe,  0x7f,  0xbe,  0xf8,  0xfc,  0xfc,  0xfe,  0xfe,  0x7e,  0x9d,  0xc0,  0x01,  0x03,  0x00,  0x00,  0x3f,  0x07,  0x0f,  0x1f,  0x01,  0x03,  0x07,  0x07,  0x3f,  0x04,  0x03,  0xcf,  0xe0,  0xf0,  0x00,  0x00,  0xff,  0xf8,  0xfc,  0xfe,  0xe0,  0xf0,  0xf8,  0xf8,  0xff,  0x08,  0xf0,  0xfc,  0x07,  0x2f,  0x1f,  0x1f,  0x1f,  0x1f,  0x3f,  0x1f,  0xc7,  0x0f,  0x0f,  0x1f,  0x1f,  0x1f,  0x1e,  0x00,  0xf8,  0xfc,  0xfc,  0xfe,  0xfe,  0xfe,  0x87,  0x7a,  0xf8,  0xfc,  0xfc,  0xfe,  0xfe,  0x86,  0x7a,  0xfc);
}